

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda1.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  anon_class_16_2_947320ea f;
  int local_24;
  anon_class_16_2_947320ea local_20;
  
  local_20.x = 0;
  local_20.y = &local_24;
  local_24 = 0x4d;
  main::anon_class_16_2_947320ea::operator()(&local_20);
  main::anon_class_16_2_947320ea::operator()(&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"Finally y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	int x = 0;
	int y = 42;

	auto f = [x, &y] {
		cout << "x: " << x << endl;
		cout << "y: " << y << endl;
		++y;
	};

	// auto f = [x, &y]() mutable {
	// 	cout << "x: " << x << endl;
	// 	cout << "y: " << y << endl;
	// 	++x;
	// 	++y;
	// };

	x = y = 77;
	f();
	f();

	cout << "Finally y: " << y << endl;
	return 0;
}